

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeAtomic(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  double dVar1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  undefined8 uVar4;
  int8_t iVar5;
  uint32_t uVar6;
  int iVar7;
  AtomicRMWOp AVar8;
  Expression *pEVar9;
  Expression *pEVar10;
  Expression *pEVar11;
  Expression *pEVar12;
  Id local_48;
  
  if (((byte)this->wasm[0x178] & 1) == 0) {
    __assert_fail("wasm.features.hasAtomics()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1120,"Expression *wasm::TranslateToFuzzReader::makeAtomic(Type)");
  }
  if (this->allowMemory == false) {
    pEVar9 = makeTrivial(this,type);
    return pEVar9;
  }
  *(undefined1 *)(**(long **)(this->wasm + 0x78) + 0x48) = 1;
  if (type.id == 2) {
    uVar6 = Random::upTo(&this->random,2);
    if (uVar6 == 0) {
      pEVar9 = makePointer(this);
      pEVar10 = make(this,(Type)0x2);
      iVar5 = Random::get(&this->random);
      dVar1 = log((double)(iVar5 + 1 + (uint)(iVar5 == -1)));
      dVar1 = floor(dVar1);
      uVar2 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
      uVar3 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
      pEVar12 = (Expression *)
                MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x38,8);
      *(undefined8 *)pEVar12 = 0;
      (pEVar12->type).id = 0;
      *(undefined8 *)(pEVar12 + 2) = 0;
      pEVar12[2].type.id = 0;
      *(undefined8 *)(pEVar12 + 1) = 0;
      pEVar12[1].type.id = 0;
      *(undefined8 *)(pEVar12 + 3) = 0;
      pEVar12->_id = AtomicNotifyId;
      pEVar12[2].type.id = 0;
      *(undefined8 *)(pEVar12 + 3) = 0;
      (pEVar12->type).id = 0;
      *(undefined8 *)(pEVar12 + 1) = 0;
      *(ulong *)(pEVar12 + 1) = (long)dVar1 & 0xffffffff;
      pEVar12[1].type.id = (uintptr_t)pEVar9;
      *(Expression **)(pEVar12 + 2) = pEVar10;
      wasm::AtomicNotify::finalize();
      pEVar12[2].type.id = uVar2;
      *(uintptr_t *)(pEVar12 + 3) = uVar3;
      return pEVar12;
    }
  }
  else if (type.id == 0) {
    pEVar9 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x18,8);
    *(undefined8 *)pEVar9 = 0;
    (pEVar9->type).id = 0;
    *(undefined8 *)(pEVar9 + 1) = 0;
    pEVar9->_id = AtomicFenceId;
    (pEVar9->type).id = 0;
    pEVar9[1]._id = InvalidId;
    return pEVar9;
  }
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)type.id != 3) {
    if ((int)type.id != 2) {
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x1161);
    }
    uVar6 = Random::upTo(&this->random,3);
    if (uVar6 == 0) {
switchD_00131351_caseD_0:
      local_48 = BlockId;
    }
    else {
      if (uVar6 == 2) goto switchD_00131351_caseD_2;
      if (uVar6 != 1) {
        wasm::handle_unreachable
                  ("invalide value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x1149);
      }
switchD_00131351_caseD_1:
      iVar7 = Random::pick<int,int>(&this->random,1,2);
      local_48 = (Id)iVar7;
    }
LAB_00131466:
    this_00 = &this->random;
    iVar5 = Random::get(this_00);
    dVar1 = log((double)(iVar5 + 1 + (uint)(iVar5 == -1)));
    dVar1 = floor(dVar1);
    pEVar9 = makePointer(this);
    uVar6 = Random::upTo(this_00,2);
    pEVar10 = make(this,type);
    if (uVar6 == 0) {
      AVar8 = Random::
              pick<wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp>
                        (this_00,RMWAdd,RMWSub,RMWAnd,RMWOr,RMWXor,RMWXchg);
      uVar4 = *(undefined8 *)**(long **)(this->wasm + 0x78);
      uVar2 = ((undefined8 *)**(long **)(this->wasm + 0x78))[1];
      pEVar12 = (Expression *)
                MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x40,8);
      *(undefined8 *)pEVar12 = 0;
      (pEVar12->type).id = 0;
      *(undefined8 *)(pEVar12 + 1) = 0;
      pEVar12[1].type.id = 0;
      *(undefined8 *)(pEVar12 + 2) = 0;
      pEVar12[2].type.id = 0;
      *(undefined8 *)(pEVar12 + 3) = 0;
      pEVar12[3].type.id = 0;
      pEVar12->_id = AtomicRMWId;
      *(AtomicRMWOp *)(pEVar12 + 1) = AVar8;
      pEVar12[1].field_0x4 = local_48;
      pEVar12[1].type.id = (long)dVar1 & 0xffffffffU;
      *(Expression **)(pEVar12 + 2) = pEVar9;
      pEVar12[2].type.id = (uintptr_t)pEVar10;
      (pEVar12->type).id = type.id;
      wasm::AtomicRMW::finalize();
      *(undefined8 *)(pEVar12 + 3) = uVar4;
      pEVar12[3].type.id = uVar2;
    }
    else {
      pEVar11 = make(this,type);
      uVar2 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
      uVar3 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
      pEVar12 = (Expression *)
                MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x48,8);
      *(undefined8 *)pEVar12 = 0;
      (pEVar12->type).id = 0;
      *(undefined8 *)(pEVar12 + 3) = 0;
      pEVar12[3].type.id = 0;
      *(undefined8 *)(pEVar12 + 1) = 0;
      pEVar12[1].type.id = 0;
      *(undefined8 *)(pEVar12 + 2) = 0;
      pEVar12[2].type.id = 0;
      *(undefined8 *)(pEVar12 + 4) = 0;
      pEVar12->_id = AtomicCmpxchgId;
      pEVar12[3].type.id = 0;
      *(undefined8 *)(pEVar12 + 4) = 0;
      pEVar12[1]._id = local_48;
      pEVar12[1].type.id = (long)dVar1 & 0xffffffffU;
      *(Expression **)(pEVar12 + 2) = pEVar9;
      pEVar12[2].type.id = (uintptr_t)pEVar10;
      *(Expression **)(pEVar12 + 3) = pEVar11;
      (pEVar12->type).id = type.id;
      wasm::AtomicCmpxchg::finalize();
      pEVar12[3].type.id = uVar2;
      *(uintptr_t *)(pEVar12 + 4) = uVar3;
    }
    return pEVar12;
  }
  uVar6 = Random::upTo(&this->random,4);
  switch(uVar6) {
  case 0:
    goto switchD_00131351_caseD_0;
  case 1:
    goto switchD_00131351_caseD_1;
  case 2:
switchD_00131351_caseD_2:
    iVar7 = Random::pick<int,int,int>(&this->random,1,2,4);
    local_48 = (Id)iVar7;
    goto LAB_00131466;
  case 3:
    iVar7 = Random::pick<int,int,int,int>(&this->random,1,2,4,8);
    local_48 = (Id)iVar7;
    goto LAB_00131466;
  default:
    wasm::handle_unreachable
              ("invalide value",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x115c);
  }
}

Assistant:

Expression* TranslateToFuzzReader::makeAtomic(Type type) {
  assert(wasm.features.hasAtomics());
  if (!allowMemory) {
    return makeTrivial(type);
  }
  wasm.memories[0]->shared = true;
  if (type == Type::none) {
    return builder.makeAtomicFence();
  }
  if (type == Type::i32 && oneIn(2)) {
    if (ATOMIC_WAITS && oneIn(2)) {
      auto* ptr = makePointer();
      auto expectedType = pick(Type::i32, Type::i64);
      auto* expected = make(expectedType);
      auto* timeout = make(Type::i64);
      return builder.makeAtomicWait(ptr,
                                    expected,
                                    timeout,
                                    expectedType,
                                    logify(get()),
                                    wasm.memories[0]->name);
    } else {
      auto* ptr = makePointer();
      auto* count = make(Type::i32);
      return builder.makeAtomicNotify(
        ptr, count, logify(get()), wasm.memories[0]->name);
    }
  }
  Index bytes;
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        case 3:
          bytes = pick(1, 2, 4, 8);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  auto offset = logify(get());
  auto* ptr = makePointer();
  if (oneIn(2)) {
    auto* value = make(type);
    return builder.makeAtomicRMW(
      pick(RMWAdd, RMWSub, RMWAnd, RMWOr, RMWXor, RMWXchg),
      bytes,
      offset,
      ptr,
      value,
      type,
      wasm.memories[0]->name);
  } else {
    auto* expected = make(type);
    auto* replacement = make(type);
    return builder.makeAtomicCmpxchg(
      bytes, offset, ptr, expected, replacement, type, wasm.memories[0]->name);
  }
}